

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall SuiteMessageTests::TestisApp::TestisApp(TestisApp *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"isApp","MessageTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x58);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031db90;
  return;
}

Assistant:

TEST(isApp)
{
  FIX::Message object;
  CHECK( !object.isApp() );
  object.getHeader().setField( FIX::MsgType("A") );
  CHECK( !object.isApp() );
  object.getHeader().setField( FIX::MsgType("D") );
  CHECK( object.isApp() );
}